

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * prvTidyInferredTag(TidyDocImpl *doc,TidyTagId id)

{
  Lexer *lexer_00;
  Node *pNVar1;
  Dict *pDVar2;
  tmbstr ptVar3;
  Dict *dict;
  Node *node;
  Lexer *lexer;
  TidyTagId id_local;
  TidyDocImpl *doc_local;
  
  lexer_00 = doc->lexer;
  pNVar1 = prvTidyNewNode(lexer_00->allocator,lexer_00);
  pDVar2 = prvTidyLookupTagDef(id);
  if (pDVar2 != (Dict *)0x0) {
    pNVar1->type = StartTag;
    pNVar1->implicit = yes;
    ptVar3 = prvTidytmbstrdup(doc->allocator,pDVar2->name);
    pNVar1->element = ptVar3;
    pNVar1->tag = pDVar2;
    pNVar1->start = lexer_00->txtstart;
    pNVar1->end = lexer_00->txtend;
    return pNVar1;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/lexer.c",
                0x883,"Node *prvTidyInferredTag(TidyDocImpl *, TidyTagId)");
}

Assistant:

Node* TY_(InferredTag)(TidyDocImpl* doc, TidyTagId id)
{
    Lexer *lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    const Dict* dict = TY_(LookupTagDef)(id);

    assert( dict != NULL );

    node->type = StartTag;
    node->implicit = yes;
    node->element = TY_(tmbstrdup)(doc->allocator, dict->name);
    node->tag = dict;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;

    return node;
}